

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O3

void gravity_well_explode(ROOM_INDEX_DATA *room,ROOM_AFFECT_DATA *af)

{
  CHAR_DATA *ch;
  CHAR_DATA *pCVar1;
  int idam;
  bool bVar2;
  bool bVar3;
  int iVar4;
  bool bVar5;
  OBJ_DATA *obj;
  CHAR_DATA *pCVar6;
  
  ch = af->owner;
  affect_strip_area(room->area,(int)gsn_gravity_well);
  obj = object_list;
  while( true ) {
    if (obj == (OBJ_DATA *)0x0) {
      return;
    }
    if ((obj->item_type == 0x26) && (obj->in_room != (ROOM_INDEX_DATA *)0x0 && obj->in_room == room)
       ) break;
    obj = obj->next;
  }
  send_to_char("You lose control of your gravity well and it ruptures violently!\n\r",ch);
  pCVar6 = obj->in_room->people;
  if (pCVar6 != (CHAR_DATA *)0x0) {
    act("The gravity well flares brightly and explodes, sending waves of force rippling outward!",
        pCVar6,(void *)0x0,(void *)0x0,4);
  }
  extract_obj(obj);
  affect_strip_room(room,(int)gsn_gravity_well);
  if (room->people == (CHAR_DATA *)0x0) {
    return;
  }
  bVar5 = true;
  pCVar6 = room->people;
  do {
    pCVar1 = pCVar6->next_in_room;
    bVar2 = is_npc(pCVar6);
    if ((bVar2) || (bVar3 = is_safe_new(ch,pCVar6,false), bVar2 = bVar5, !bVar3)) {
      iVar4 = dice(0x14,0x14);
      idam = iVar4 / 2;
      if (ch != pCVar6) {
        idam = iVar4;
      }
      if (ch->in_room == (ROOM_INDEX_DATA *)0x0) {
        char_to_room(ch,room);
        damage_new(ch,pCVar6,idam,(int)af->type,0xb,true,false,0,1,"the violent explosion*");
      }
      else {
        damage_new(ch,pCVar6,idam,(int)af->type,0xb,true,false,0,1,"the violent explosion*");
        bVar2 = true;
        if (bVar5) goto LAB_0030831d;
      }
      char_from_room(ch);
      bVar2 = false;
    }
LAB_0030831d:
    bVar5 = bVar2;
    pCVar6 = pCVar1;
    if (pCVar1 == (CHAR_DATA *)0x0) {
      return;
    }
  } while( true );
}

Assistant:

void gravity_well_explode(ROOM_INDEX_DATA *room, ROOM_AFFECT_DATA *af)
{
	CHAR_DATA *victim, *v_next, *ch = af->owner;
	OBJ_DATA *well;
	int dam;
	bool wasinroom = true;

	affect_strip_area(room->area, gsn_gravity_well);

	for (well = object_list; well != nullptr; well = well->next)
	{
		if (well->item_type == ITEM_GRAVITYWELL && well->in_room && well->in_room == room)
			break;
	}

	if (!well)
		return;

	send_to_char("You lose control of your gravity well and it ruptures violently!\n\r", ch);

	if (well->in_room->people)
		act("The gravity well flares brightly and explodes, sending waves of force rippling outward!", well->in_room->people, 0, 0, TO_ALL);

	extract_obj(well);
	affect_strip_room(room, gsn_gravity_well);

	for (victim = room->people; victim != nullptr; victim = v_next)
	{
		v_next = victim->next_in_room;

		if (!is_npc(victim) && is_safe_new(ch, victim, false))
			continue;

		dam = dice(20, 20);

		if (ch == victim)
			dam /= 2;

		if (!ch->in_room)
		{
			char_to_room(ch, room);
			wasinroom = false;
		}

		damage_new(ch, victim, dam, af->type, DAM_ENERGY, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "the violent explosion*");

		if (!wasinroom)
			char_from_room(ch);
	}
}